

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

void __thiscall
tcu::anon_unknown_0::decompressEAC_R11
          (anon_unknown_0 *this,PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  ulong uVar1;
  int i;
  int iVar2;
  long lVar3;
  int y;
  ulong uVar4;
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined1 auVar7 [14];
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  deUint8 uncompressedBlock [32];
  ulong local_38 [4];
  undefined1 auVar15 [16];
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = (ulong)src[lVar3] | uVar4 << 8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  auVar5._1_3_ = 0;
  auVar5[0] = signedMode;
  EtcDecompressInternal::decompressEAC11Block((deUint8 *)local_38,uVar4,signedMode);
  auVar5[4] = signedMode;
  auVar5._5_3_ = 0;
  auVar5[8] = signedMode;
  auVar5._9_3_ = 0;
  auVar5[0xc] = signedMode;
  auVar5._13_3_ = 0;
  iVar2 = 0;
  lVar3 = 0;
  do {
    uVar4 = local_38[lVar3];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar4;
    uVar6 = (ushort)uVar4;
    uVar11 = (ushort)(uVar4 >> 0x10);
    auVar17._2_2_ = -uVar11;
    auVar17._0_2_ = -uVar6;
    uVar12 = (ushort)(uVar4 >> 0x20);
    auVar17._4_2_ = -uVar12;
    uVar13 = (ushort)(uVar4 >> 0x30);
    auVar17._6_2_ = -uVar13;
    auVar17._8_8_ = 0;
    auVar9 = psllw(auVar8,5);
    uVar1 = CONCAT26(uVar13 >> 6,CONCAT24(uVar12 >> 6,CONCAT22(uVar11 >> 6,uVar6 >> 6))) |
            auVar9._0_8_;
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar4;
    auVar15._12_2_ = uVar13;
    auVar15._14_2_ = uVar13;
    auVar14._12_4_ = auVar15._12_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar4;
    auVar14._10_2_ = uVar12;
    auVar7._0_2_ = -(ushort)((short)uVar6 < 0);
    auVar7._2_2_ = -(ushort)((short)uVar6 < 0);
    auVar7._4_2_ = -(ushort)((short)uVar11 < 0);
    auVar7._6_2_ = -(ushort)((short)uVar11 < 0);
    auVar7._8_2_ = -(ushort)((short)uVar12 < 0);
    auVar7._10_2_ = -(ushort)((short)uVar12 < 0);
    auVar7._12_2_ = -(ushort)((long)uVar4 < 0);
    auVar19._14_2_ = -(ushort)(auVar14._10_6_ < 0);
    auVar19._0_14_ = auVar7;
    auVar9._14_2_ = 0;
    auVar9._0_14_ = auVar7;
    auVar8 = pshuflw(~auVar19 & auVar5,~auVar19 & auVar5,0xe8);
    auVar8 = pshufhw(auVar8,auVar8,0xe8);
    auVar10._0_4_ = auVar8._0_4_;
    auVar10._8_4_ = auVar8._8_4_;
    auVar10._12_4_ = auVar8._12_4_;
    auVar10._4_4_ = auVar10._8_4_;
    auVar8 = psllw(auVar10,0xf);
    auVar8 = psraw(auVar8,0xf);
    auVar9 = pshuflw(auVar5 & auVar9,auVar5 & auVar9,0xe8);
    auVar9 = pshufhw(auVar9,auVar9,0xe8);
    auVar16._0_4_ = auVar9._0_4_;
    auVar16._8_4_ = auVar9._8_4_;
    auVar16._12_4_ = auVar9._12_4_;
    auVar16._4_4_ = auVar16._8_4_;
    auVar9 = psllw(auVar16,0xf);
    auVar9 = psraw(auVar9,0xf);
    auVar19 = psllw(auVar17,5);
    auVar18._0_2_ = (ushort)-uVar6 >> 6;
    auVar18._2_2_ = (ushort)-uVar11 >> 6;
    auVar18._4_2_ = (ushort)-uVar12 >> 6;
    auVar18._6_2_ = (ushort)-uVar13 >> 6;
    auVar18._8_8_ = 0;
    auVar18 = auVar18 | auVar19;
    *(ulong *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + (long)iVar2 + -8) =
         ~auVar8._0_8_ &
         (~auVar9._0_8_ & uVar1 |
         CONCAT26(-auVar18._6_2_,CONCAT24(-auVar18._4_2_,CONCAT22(-auVar18._2_2_,-auVar18._0_2_))) &
         auVar9._0_8_) | uVar1 & auVar8._0_8_;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + (int)this;
  } while (lVar3 != 4);
  return;
}

Assistant:

void decompressEAC_R11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_R11;

	const deUint64	compressedBlock = get64BitBlock(src, 0);
	deUint8			uncompressedBlock[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlock, compressedBlock, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_R11 == 2);

			if (signedMode)
			{
				const deInt16* const	srcPixel = (deInt16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel = (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixel[0]);
			}
			else
			{
				const deUint16* const	srcPixel = (deUint16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel = (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixel[0]);
			}
		}
	}
}